

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t helper_add_b(CPUTriCoreState *env,target_ulong_conflict r1,target_ulong_conflict r2)

{
  int32_t iVar1;
  int32_t iVar2;
  uint uVar3;
  bool local_35;
  uint local_34;
  uint local_30;
  uint32_t ret;
  int32_t avf;
  int32_t ovf;
  int32_t extr_r2;
  int32_t extr_r1;
  int32_t i;
  int32_t b;
  target_ulong_conflict r2_local;
  target_ulong_conflict r1_local;
  CPUTriCoreState *env_local;
  
  ret = 0;
  local_30 = 0;
  local_34 = 0;
  for (extr_r2 = 0; extr_r2 < 4; extr_r2 = extr_r2 + 1) {
    iVar1 = sextract32(r1,extr_r2 << 3,8);
    iVar2 = sextract32(r2,extr_r2 << 3,8);
    uVar3 = iVar1 + iVar2;
    local_35 = 0x7f < (int)uVar3 || (int)uVar3 < -0x80;
    ret = local_35 | ret;
    local_30 = uVar3 ^ uVar3 * 2 | local_30;
    local_34 = (uVar3 & 0xff) << ((byte)(extr_r2 << 3) & 0x1f) | local_34;
  }
  env->PSW_USB_V = ret << 0x1f;
  env->PSW_USB_SV = env->PSW_USB_V | env->PSW_USB_SV;
  env->PSW_USB_AV = local_30 << 0x18;
  env->PSW_USB_SAV = env->PSW_USB_AV | env->PSW_USB_SAV;
  return local_34;
}

Assistant:

uint32_t helper_add_b(CPUTriCoreState *env, target_ulong r1, target_ulong r2)
{
    int32_t b, i;
    int32_t extr_r1, extr_r2;
    int32_t ovf = 0;
    int32_t avf = 0;
    uint32_t ret = 0;

    for (i = 0; i < 4; i++) {
        extr_r1 = sextract32(r1, i * 8, 8);
        extr_r2 = sextract32(r2, i * 8, 8);

        b = extr_r1 + extr_r2;
        ovf |= ((b > 0x7f) || (b < -0x80));
        avf |= b ^ b * 2u;
        ret |= ((b & 0xff) << (i*8));
    }

    env->PSW_USB_V = (ovf << 31);
    env->PSW_USB_SV |= env->PSW_USB_V;
    env->PSW_USB_AV = avf << 24;
    env->PSW_USB_SAV |= env->PSW_USB_AV;

    return ret;
}